

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O0

void * ipasir_init(void)

{
  void *pvVar1;
  IPAsirMiniSAT *unaff_retaddr;
  
  pvVar1 = operator_new(0x1560);
  IPAsirMiniSAT::IPAsirMiniSAT(unaff_retaddr);
  return pvVar1;
}

Assistant:

void *ipasir_init() { return new IPAsirMiniSAT(); }